

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O0

tnt_iter * tnt_iter_init(tnt_iter *i)

{
  tnt_iter *ptStack_18;
  int alloc;
  tnt_iter *i_local;
  
  ptStack_18 = i;
  if (((i == (tnt_iter *)0x0) == 0) ||
     (ptStack_18 = (tnt_iter *)tnt_mem_alloc(0xa8), ptStack_18 != (tnt_iter *)0x0)) {
    memset(ptStack_18,0,0xa8);
    ptStack_18->status = TNT_ITER_OK;
    ptStack_18->alloc = (uint)(i == (tnt_iter *)0x0);
    i_local = ptStack_18;
  }
  else {
    i_local = (tnt_iter *)0x0;
  }
  return i_local;
}

Assistant:

static struct tnt_iter *tnt_iter_init(struct tnt_iter *i) {
	int alloc = (i == NULL);
	if (alloc) {
		i = tnt_mem_alloc(sizeof(struct tnt_iter));
		if (i == NULL)
			return NULL;
	}
	memset(i, 0, sizeof(struct tnt_iter));
	i->status = TNT_ITER_OK;
	i->alloc = alloc;
	return i;
}